

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,ShaderImageLoadStoreBase *this,Vector<int,_4> *v)

{
  ostream *poVar1;
  string *psVar2;
  bool *pbVar3;
  int i;
  long lVar4;
  ostringstream s;
  undefined1 auStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"[",1);
  lVar4 = 0;
  do {
    poVar1 = (ostream *)std::ostream::operator<<(auStack_1a8,*(int *)(this + lVar4 * 4));
    pbVar3 = fixed_sample_locations_values + 1;
    if (lVar4 != 3) {
      pbVar3 = (bool *)0x1cafe51;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pbVar3,(ulong)(lVar4 != 3));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string ToString(T v)
	{
		std::ostringstream s;
		s << "[";
		for (int i = 0; i < 4; ++i)
			s << v[i] << (i == 3 ? "" : ",");
		s << "]";
		return s.str();
	}